

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O0

int mbedtls_constant_time_memcmp(void *v1,void *v2,size_t len)

{
  undefined1 local_39;
  ulong uStack_38;
  uchar diff;
  size_t i;
  uchar *p2;
  uchar *p1;
  size_t len_local;
  void *v2_local;
  void *v1_local;
  
  local_39 = 0;
  for (uStack_38 = 0; uStack_38 < len; uStack_38 = uStack_38 + 1) {
    local_39 = local_39 | *(byte *)((long)v1 + uStack_38) ^ *(byte *)((long)v2 + uStack_38);
  }
  return (int)local_39;
}

Assistant:

static int mbedtls_constant_time_memcmp( const void *v1, const void *v2,
                                         size_t len )
{
    const unsigned char *p1 = (const unsigned char*) v1;
    const unsigned char *p2 = (const unsigned char*) v2;
    size_t i;
    unsigned char diff;

    for( diff = 0, i = 0; i < len; i++ )
        diff |= p1[i] ^ p2[i];

    return( (int)diff );
}